

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O0

void __thiscall
btLCP::transfer_i_from_C_to_N(btLCP *this,int i,btAlignedObjectArray<float> *scratch)

{
  int iVar1;
  int in_EDX;
  btScalar *unaff_RBX;
  int in_ESI;
  btScalar *in_RDI;
  int *unaff_R12;
  btScalar **unaff_R14;
  int unaff_retaddr;
  int in_stack_00000008;
  btAlignedObjectArray<float> *in_stack_00000010;
  int k;
  int j;
  int nC;
  int last_idx;
  int *C;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffb0;
  int iVar2;
  btScalar bVar3;
  int iVar4;
  int *findex;
  int in_stack_ffffffffffffffd0;
  btScalar *pbVar5;
  
  findex = *(int **)(in_RDI + 0x22);
  iVar4 = -1;
  bVar3 = in_RDI[3];
  for (iVar2 = 0; pbVar5 = in_RDI, iVar2 < (int)bVar3; iVar2 = iVar2 + 1) {
    if (findex[iVar2] == (int)bVar3 + -1) {
      iVar4 = iVar2;
    }
    if (findex[iVar2] == in_ESI) {
      btLDLTRemove(unaff_R14,unaff_R12,unaff_RBX,in_RDI,in_ESI,in_stack_ffffffffffffffd0,
                   unaff_retaddr,in_stack_00000008,in_stack_00000010);
      in_stack_ffffffffffffffb0 = iVar4;
      iVar1 = iVar2;
      if (iVar4 != -1) goto LAB_0025bc89;
      goto LAB_0025bc4c;
    }
  }
  goto LAB_0025bd03;
  while (iVar1 = in_stack_ffffffffffffffb0, findex[in_stack_ffffffffffffffb0] != (int)bVar3 + -1) {
LAB_0025bc4c:
    in_stack_ffffffffffffffb0 = iVar1 + 1;
    if ((int)bVar3 <= in_stack_ffffffffffffffb0) break;
  }
LAB_0025bc89:
  findex[in_stack_ffffffffffffffb0] = findex[iVar2];
  if (iVar2 < (int)bVar3 + -1) {
    memmove(findex + iVar2,findex + (long)iVar2 + 1,(long)(((int)bVar3 - iVar2) + -1) << 2);
  }
LAB_0025bd03:
  btSwapProblem((btScalar **)CONCAT44(in_stack_ffffffffffffffa4,1),
                (btScalar *)CONCAT44(in_stack_ffffffffffffff9c,in_RDI[1]),
                (btScalar *)CONCAT44(in_stack_ffffffffffffff94,(int)bVar3 + -1),
                (btScalar *)CONCAT44(in_stack_ffffffffffffff8c,in_ESI),
                (btScalar *)CONCAT44(in_stack_ffffffffffffff84,*in_RDI),
                *(btScalar **)(in_RDI + 0x1e),(int *)CONCAT44(iVar2,in_stack_ffffffffffffffb0),
                (bool *)CONCAT44(iVar4,bVar3),findex,in_EDX,in_stack_ffffffffffffffd0,(int)pbVar5,
                (int)unaff_RBX,(int)unaff_R12);
  in_RDI[4] = (btScalar)((int)in_RDI[4] + 1);
  in_RDI[3] = (btScalar)((int)bVar3 + -1);
  return;
}

Assistant:

void btLCP::transfer_i_from_C_to_N (int i, btAlignedObjectArray<btScalar>& scratch)
{
  {
    int *C = m_C;
    // remove a row/column from the factorization, and adjust the
    // indexes (black magic!)
    int last_idx = -1;
    const int nC = m_nC;
    int j = 0;
    for ( ; j<nC; ++j) {
      if (C[j]==nC-1) {
        last_idx = j;
      }
      if (C[j]==i) {
        btLDLTRemove (m_A,C,m_L,m_d,m_n,nC,j,m_nskip,scratch);
        int k;
        if (last_idx == -1) {
          for (k=j+1 ; k<nC; ++k) {
            if (C[k]==nC-1) {
              break;
            }
          }
          btAssert (k < nC);
        }
        else {
          k = last_idx;
        }
        C[k] = C[j];
        if (j < (nC-1)) memmove (C+j,C+j+1,(nC-j-1)*sizeof(int));
        break;
      }
    }
    btAssert (j < nC);

    btSwapProblem (m_A,m_x,m_b,m_w,m_lo,m_hi,m_p,m_state,m_findex,m_n,i,nC-1,m_nskip,1);

    m_nN++;
    m_nC = nC - 1; // nC value is outdated after this line
  }

}